

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O0

void Bdc_ManDecPrintSimple(Bdc_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Bdc_Fun_t *pFun;
  Bdc_Fun_t *pBVar4;
  uint local_1c;
  int i;
  Bdc_Fun_t *pNode;
  Bdc_Man_t *p_local;
  
  printf(" 0 : Const 1\n");
  for (local_1c = 1; (int)local_1c < p->nNodes; local_1c = local_1c + 1) {
    printf(" %d : ",(ulong)local_1c);
    pBVar4 = p->pNodes + (int)local_1c;
    if (pBVar4->Type == 2) {
      printf("PI   ");
    }
    else {
      iVar1 = Bdc_IsComplement(pBVar4->pFan0);
      pcVar3 = "";
      if (iVar1 != 0) {
        pcVar3 = "-";
      }
      pFun = Bdc_Regular(pBVar4->pFan0);
      uVar2 = Bdc_FunId(p,pFun);
      printf("%s%d &",pcVar3,(ulong)uVar2);
      iVar1 = Bdc_IsComplement(pBVar4->pFan1);
      pcVar3 = "";
      if (iVar1 != 0) {
        pcVar3 = "-";
      }
      pBVar4 = Bdc_Regular(pBVar4->pFan1);
      uVar2 = Bdc_FunId(p,pBVar4);
      printf(" %s%d   ",pcVar3,(ulong)uVar2);
    }
    printf("\n");
  }
  iVar1 = Bdc_IsComplement(p->pRoot);
  pcVar3 = "";
  if (iVar1 != 0) {
    pcVar3 = "-";
  }
  pBVar4 = Bdc_Regular(p->pRoot);
  uVar2 = Bdc_FunId(p,pBVar4);
  printf("Root = %s%d.\n",pcVar3,(ulong)uVar2);
  return;
}

Assistant:

void Bdc_ManDecPrintSimple( Bdc_Man_t * p )
{
    Bdc_Fun_t * pNode;
    int i;
    printf( " 0 : Const 1\n" );
    for ( i = 1; i < p->nNodes; i++ )
    {
        printf( " %d : ", i );
        pNode = p->pNodes + i;
        if ( pNode->Type == BDC_TYPE_PI )
            printf( "PI   " );
        else
        {
            printf( "%s%d &", Bdc_IsComplement(pNode->pFan0)? "-":"", Bdc_FunId(p,Bdc_Regular(pNode->pFan0)) );
            printf( " %s%d   ", Bdc_IsComplement(pNode->pFan1)? "-":"", Bdc_FunId(p,Bdc_Regular(pNode->pFan1)) );
        }
//        Extra_PrintBinary( stdout, pNode->puFunc, (1<<p->nVars) );
        printf( "\n" );
    }
    printf( "Root = %s%d.\n", Bdc_IsComplement(p->pRoot)? "-":"", Bdc_FunId(p,Bdc_Regular(p->pRoot)) );
}